

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

StringRef __thiscall
Catch::anon_unknown_23::extractFilenamePart(anon_unknown_23 *this,StringRef filename)

{
  char cVar1;
  bool bVar2;
  StringRef SVar3;
  size_type local_38;
  size_t nameStart;
  size_t lastDot;
  StringRef filename_local;
  
  filename_local.m_start = filename.m_start;
  lastDot = (size_t)this;
  nameStart = StringRef::size((StringRef *)&lastDot);
  while( true ) {
    bVar2 = false;
    if (nameStart != 0) {
      cVar1 = StringRef::operator[]((StringRef *)&lastDot,nameStart - 1);
      bVar2 = cVar1 != '.';
    }
    if (!bVar2) break;
    nameStart = nameStart - 1;
  }
  local_38 = nameStart - 1;
  while( true ) {
    bVar2 = false;
    if (local_38 != 0) {
      cVar1 = StringRef::operator[]((StringRef *)&lastDot,local_38 - 1);
      bVar2 = false;
      if (cVar1 != '/') {
        cVar1 = StringRef::operator[]((StringRef *)&lastDot,local_38 - 1);
        bVar2 = cVar1 != '\\';
      }
    }
    if (!bVar2) break;
    local_38 = local_38 - 1;
  }
  SVar3 = StringRef::substr((StringRef *)&lastDot,local_38,(nameStart - 1) - local_38);
  return SVar3;
}

Assistant:

StringRef extractFilenamePart(StringRef filename) {
            size_t lastDot = filename.size();
            while (lastDot > 0 && filename[lastDot - 1] != '.') {
                --lastDot;
            }
            --lastDot;

            size_t nameStart = lastDot;
            while (nameStart > 0 && filename[nameStart - 1] != '/' && filename[nameStart - 1] != '\\') {
                --nameStart;
            }

            return filename.substr(nameStart, lastDot - nameStart);
        }